

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharacterSet.cpp
# Opt level: O0

CharacterSet ZXing::CharacterSetFromString(string_view name)

{
  CharacterSetName *pCVar1;
  CharacterSetName *pCVar2;
  string_view in_stack_00000030;
  CharacterSetName *i;
  CharacterSet local_71;
  anon_class_32_1_ba1d7991_for__M_pred *in_stack_ffffffffffffffd8;
  CharacterSetName (*in_stack_ffffffffffffffe0) [42];
  
  NormalizeName_abi_cxx11_(in_stack_00000030);
  pCVar1 = FindIf<ZXing::CharacterSetName[42],ZXing::CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::__0>
                     (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8);
  CharacterSetFromString(std::basic_string_view<char,std::char_traits<char>>)::$_0::~__0
            ((anon_class_32_1_ba1d7991_for__M_pred *)0x21f2b3);
  pCVar2 = std::end<ZXing::CharacterSetName,42ul>((CharacterSetName (*) [42])NAME_TO_CHARSET);
  if (pCVar1 == pCVar2) {
    local_71 = Unknown;
  }
  else {
    local_71 = pCVar1->cs;
  }
  return local_71;
}

Assistant:

CharacterSet CharacterSetFromString(std::string_view name)
{
	auto i = FindIf(NAME_TO_CHARSET, [str = NormalizeName(name)](auto& v) { return NormalizeName(v.name) == str; });
	return i == std::end(NAME_TO_CHARSET) ? CharacterSet::Unknown : i->cs;
}